

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

void __thiscall Omega_h::CallOp::CallOp(CallOp *this,string *name_in,Args *args_in)

{
  pointer paVar1;
  pointer operand;
  OpPtr op;
  Omega_h local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (this->super_ExprOp)._vptr_ExprOp = (_func_int **)&PTR__CallOp_0040fbe8;
  std::__cxx11::string::string((string *)&this->name,(string *)name_in);
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rhs).
  super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs).
  super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs).
  super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = (args_in->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (operand = (args_in->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                 super__Vector_impl_data._M_start; operand != paVar1; operand = operand + 1) {
    any_cast<std::shared_ptr<Omega_h::ExprOp>>(local_40,operand);
    std::
    vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>::
    push_back(&this->rhs,(value_type *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::reserve
            (&this->args,
             (long)(this->rhs).
                   super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rhs).
                   super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  return;
}

Assistant:

CallOp(std::string const& name_in, ExprEnv::Args const& args_in)
      : name(name_in) {
    for (auto& arg : args_in) {
      OpPtr op = any_cast<OpPtr>(arg);
      rhs.push_back(op);
    }
    args.reserve(rhs.size());
  }